

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void OpenDefaultList(fullpath_ref_t inputFile)

{
  bool bVar1;
  path local_60;
  undefined1 local_38 [8];
  path listName;
  fullpath_ref_t inputFile_local;
  
  if ((((Options::OutputVerbosity != 4) && ((Options::IsDefaultListingName & 1) != 0)) &&
      (FP_ListingFile == (FILE *)0x0)) &&
     (listName._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
           (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              )inputFile, bVar1 = std::filesystem::__cxx11::path::empty(&inputFile->full), !bVar1))
  {
    std::filesystem::__cxx11::path::path
              ((path *)local_38,
               (path *)listName._M_cmpts._M_impl._M_t.
                       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                       ._M_head_impl);
    std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
              (&local_60,(char (*) [4])"lst",auto_format);
    std::filesystem::__cxx11::path::replace_extension((path *)local_38);
    std::filesystem::__cxx11::path::~path(&local_60);
    OpenListImp((path *)local_38);
    std::filesystem::__cxx11::path::~path((path *)local_38);
  }
  return;
}

Assistant:

static void OpenDefaultList(fullpath_ref_t inputFile) {
	// if STDERR is configured to contain listing, disable other listing files
	if (OV_LST == Options::OutputVerbosity) return;
	// check if listing file is already opened, or it is set to explicit file name
	if (!Options::IsDefaultListingName || NULL != FP_ListingFile) return;
	if (inputFile.full.empty()) return;		// no filename provided
	// Create default listing name, and try to open it
	std::filesystem::path listName { inputFile.full };
	listName.replace_extension("lst");
	OpenListImp(listName);
}